

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O1

void __thiscall
Lib::
Stack<std::unique_ptr<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>_>_>_>
::~Stack(Stack<std::unique_ptr<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>_>_>_>
         *this)

{
  Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_> *this_00;
  ulong uVar1;
  unique_ptr<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>_>_>
  *puVar2;
  void **head;
  unique_ptr<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>_>_>
  *puVar3;
  
  puVar2 = this->_stack;
  puVar3 = this->_cursor;
  if (puVar3 != puVar2) {
    do {
      this_00 = puVar3[-1]._M_t.
                super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>_>_>
                .
                super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>_*,_false>
                ._M_head_impl;
      if (this_00 != (Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_> *)0x0) {
        Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>::~Stack(this_00);
        this_00->_capacity = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = this_00;
      }
      puVar3 = puVar3 + -1;
      (puVar3->_M_t).
      super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>_>_>
      .
      super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>_*,_false>
      ._M_head_impl = (Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_> *)0x0;
      puVar2 = this->_stack;
    } while (puVar3 != puVar2);
  }
  if (puVar2 != (unique_ptr<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>_>_>
                 *)0x0) {
    uVar1 = this->_capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar1 == 0) {
      (puVar2->_M_t).
      super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>_>_>
      .
      super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>_*,_false>
      ._M_head_impl =
           (Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_> *)
           GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = puVar2;
    }
    else if (uVar1 < 0x11) {
      (puVar2->_M_t).
      super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>_>_>
      .
      super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>_*,_false>
      ._M_head_impl =
           (Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_> *)
           GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = puVar2;
    }
    else if (uVar1 < 0x19) {
      (puVar2->_M_t).
      super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>_>_>
      .
      super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>_*,_false>
      ._M_head_impl =
           (Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_> *)
           GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = puVar2;
    }
    else if (uVar1 < 0x21) {
      (puVar2->_M_t).
      super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>_>_>
      .
      super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>_*,_false>
      ._M_head_impl =
           (Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_> *)
           GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = puVar2;
    }
    else if (uVar1 < 0x31) {
      (puVar2->_M_t).
      super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>_>_>
      .
      super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>_*,_false>
      ._M_head_impl =
           (Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_> *)
           GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = puVar2;
    }
    else {
      if (0x40 < uVar1) {
        operator_delete(puVar2,0x10);
        return;
      }
      (puVar2->_M_t).
      super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>_>_>
      .
      super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>_*,_false>
      ._M_head_impl =
           (Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_> *)
           GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = puVar2;
    }
  }
  return;
}

Assistant:

inline ~Stack()
  {
    //The while cycle is completely eliminated by compiler
    //in "-O6 -DVDEBUG=0" mode for types without destructor,
    //so this destructor is constant time.
    C* p=_cursor;
    while(p!=_stack) {
      (--p)->~C();
    }
    if(_stack) {
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }
    else {
      ASS_EQ(_capacity,0);
    }
  }